

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

int read_markers(j_decompress_ptr cinfo)

{
  boolean bVar1;
  int iVar2;
  j_decompress_ptr in_RDI;
  boolean in_stack_00000020;
  boolean in_stack_00000024;
  j_decompress_ptr in_stack_00000028;
  j_decompress_ptr in_stack_00000038;
  j_decompress_ptr in_stack_00000148;
  
  do {
    if (in_RDI->unread_marker == 0) {
      if (in_RDI->marker->saw_SOI == 0) {
        bVar1 = first_marker(cinfo);
        if (bVar1 == 0) {
          return 0;
        }
      }
      else {
        bVar1 = next_marker(cinfo);
        if (bVar1 == 0) {
          return 0;
        }
      }
    }
    switch(in_RDI->unread_marker) {
    case 1:
    case 0xd0:
    case 0xd1:
    case 0xd2:
    case 0xd3:
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
      in_RDI->err->msg_code = 0x5c;
      (in_RDI->err->msg_parm).i[0] = in_RDI->unread_marker;
      (*in_RDI->err->emit_message)((j_common_ptr)in_RDI,1);
      break;
    default:
      in_RDI->err->msg_code = 0x44;
      (in_RDI->err->msg_parm).i[0] = in_RDI->unread_marker;
      (*in_RDI->err->error_exit)((j_common_ptr)in_RDI);
      break;
    case 0xc0:
    case 0xc1:
      bVar1 = get_sof(in_stack_00000028,in_stack_00000024,in_stack_00000020);
      if (bVar1 == 0) {
        return 0;
      }
      break;
    case 0xc2:
      bVar1 = get_sof(in_stack_00000028,in_stack_00000024,in_stack_00000020);
      if (bVar1 == 0) {
        return 0;
      }
      break;
    case 0xc3:
    case 0xc5:
    case 0xc6:
    case 199:
    case 200:
    case 0xcb:
    case 0xcd:
    case 0xce:
    case 0xcf:
      in_RDI->err->msg_code = 0x3c;
      (in_RDI->err->msg_parm).i[0] = in_RDI->unread_marker;
      (*in_RDI->err->error_exit)((j_common_ptr)in_RDI);
      break;
    case 0xc4:
      bVar1 = get_dht(in_stack_00000148);
      if (bVar1 == 0) {
        return 0;
      }
      break;
    case 0xc9:
      bVar1 = get_sof(in_stack_00000028,in_stack_00000024,in_stack_00000020);
      if (bVar1 == 0) {
        return 0;
      }
      break;
    case 0xca:
      bVar1 = get_sof(in_stack_00000028,in_stack_00000024,in_stack_00000020);
      if (bVar1 == 0) {
        return 0;
      }
      break;
    case 0xcc:
      bVar1 = get_dac(cinfo);
      if (bVar1 == 0) {
        return 0;
      }
      break;
    case 0xd8:
      bVar1 = get_soi(in_RDI);
      if (bVar1 == 0) {
        return 0;
      }
      break;
    case 0xd9:
      in_RDI->err->msg_code = 0x55;
      (*in_RDI->err->emit_message)((j_common_ptr)in_RDI,1);
      in_RDI->unread_marker = 0;
      return 2;
    case 0xda:
      bVar1 = get_sos(in_stack_00000038);
      if (bVar1 == 0) {
        return 0;
      }
      in_RDI->unread_marker = 0;
      return 1;
    case 0xdb:
      bVar1 = get_dqt(in_stack_00000028);
      if (bVar1 == 0) {
        return 0;
      }
      break;
    case 0xdc:
      bVar1 = skip_variable(cinfo);
      if (bVar1 == 0) {
        return 0;
      }
      break;
    case 0xdd:
      bVar1 = get_dri(cinfo);
      if (bVar1 == 0) {
        return 0;
      }
      break;
    case 0xe0:
    case 0xe1:
    case 0xe2:
    case 0xe3:
    case 0xe4:
    case 0xe5:
    case 0xe6:
    case 0xe7:
    case 0xe8:
    case 0xe9:
    case 0xea:
    case 0xeb:
    case 0xec:
    case 0xed:
    case 0xee:
    case 0xef:
      iVar2 = (*(&in_RDI->marker[1].read_markers)[in_RDI->unread_marker + -0xe0])(in_RDI);
      if (iVar2 == 0) {
        return 0;
      }
      break;
    case 0xfe:
      iVar2 = (*in_RDI->marker[1].reset_marker_reader)(in_RDI);
      if (iVar2 == 0) {
        return 0;
      }
    }
    in_RDI->unread_marker = 0;
  } while( true );
}

Assistant:

METHODDEF(int)
read_markers(j_decompress_ptr cinfo)
{
  /* Outer loop repeats once for each marker. */
  for (;;) {
    /* Collect the marker proper, unless we already did. */
    /* NB: first_marker() enforces the requirement that SOI appear first. */
    if (cinfo->unread_marker == 0) {
      if (!cinfo->marker->saw_SOI) {
        if (!first_marker(cinfo))
          return JPEG_SUSPENDED;
      } else {
        if (!next_marker(cinfo))
          return JPEG_SUSPENDED;
      }
    }
    /* At this point cinfo->unread_marker contains the marker code and the
     * input point is just past the marker proper, but before any parameters.
     * A suspension will cause us to return with this state still true.
     */
    switch (cinfo->unread_marker) {
    case M_SOI:
      if (!get_soi(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_SOF0:                /* Baseline */
    case M_SOF1:                /* Extended sequential, Huffman */
      if (!get_sof(cinfo, FALSE, FALSE))
        return JPEG_SUSPENDED;
      break;

    case M_SOF2:                /* Progressive, Huffman */
      if (!get_sof(cinfo, TRUE, FALSE))
        return JPEG_SUSPENDED;
      break;

    case M_SOF9:                /* Extended sequential, arithmetic */
      if (!get_sof(cinfo, FALSE, TRUE))
        return JPEG_SUSPENDED;
      break;

    case M_SOF10:               /* Progressive, arithmetic */
      if (!get_sof(cinfo, TRUE, TRUE))
        return JPEG_SUSPENDED;
      break;

    /* Currently unsupported SOFn types */
    case M_SOF3:                /* Lossless, Huffman */
    case M_SOF5:                /* Differential sequential, Huffman */
    case M_SOF6:                /* Differential progressive, Huffman */
    case M_SOF7:                /* Differential lossless, Huffman */
    case M_JPG:                 /* Reserved for JPEG extensions */
    case M_SOF11:               /* Lossless, arithmetic */
    case M_SOF13:               /* Differential sequential, arithmetic */
    case M_SOF14:               /* Differential progressive, arithmetic */
    case M_SOF15:               /* Differential lossless, arithmetic */
      ERREXIT1(cinfo, JERR_SOF_UNSUPPORTED, cinfo->unread_marker);
      break;

    case M_SOS:
      if (!get_sos(cinfo))
        return JPEG_SUSPENDED;
      cinfo->unread_marker = 0; /* processed the marker */
      return JPEG_REACHED_SOS;

    case M_EOI:
      TRACEMS(cinfo, 1, JTRC_EOI);
      cinfo->unread_marker = 0; /* processed the marker */
      return JPEG_REACHED_EOI;

    case M_DAC:
      if (!get_dac(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_DHT:
      if (!get_dht(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_DQT:
      if (!get_dqt(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_DRI:
      if (!get_dri(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_APP0:
    case M_APP1:
    case M_APP2:
    case M_APP3:
    case M_APP4:
    case M_APP5:
    case M_APP6:
    case M_APP7:
    case M_APP8:
    case M_APP9:
    case M_APP10:
    case M_APP11:
    case M_APP12:
    case M_APP13:
    case M_APP14:
    case M_APP15:
      if (!(*((my_marker_ptr)cinfo->marker)->process_APPn[
               cinfo->unread_marker - (int)M_APP0]) (cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_COM:
      if (!(*((my_marker_ptr)cinfo->marker)->process_COM) (cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_RST0:                /* these are all parameterless */
    case M_RST1:
    case M_RST2:
    case M_RST3:
    case M_RST4:
    case M_RST5:
    case M_RST6:
    case M_RST7:
    case M_TEM:
      TRACEMS1(cinfo, 1, JTRC_PARMLESS_MARKER, cinfo->unread_marker);
      break;

    case M_DNL:                 /* Ignore DNL ... perhaps the wrong thing */
      if (!skip_variable(cinfo))
        return JPEG_SUSPENDED;
      break;

    default:                    /* must be DHP, EXP, JPGn, or RESn */
      /* For now, we treat the reserved markers as fatal errors since they are
       * likely to be used to signal incompatible JPEG Part 3 extensions.
       * Once the JPEG 3 version-number marker is well defined, this code
       * ought to change!
       */
      ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, cinfo->unread_marker);
      break;
    }
    /* Successfully processed marker, so reset state variable */
    cinfo->unread_marker = 0;
  } /* end loop */
}